

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

int __thiscall
ExampleAppConsole::TextEditCallback(ExampleAppConsole *this,ImGuiInputTextCallbackData *data)

{
  int iVar1;
  uint uVar2;
  char **ppcVar3;
  int n;
  char *pcVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long *__dest;
  char *s2;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  ImVector<const_char_*> candidates;
  int local_78;
  long *plStack_70;
  long *local_58;
  
  if (data->EventFlag != 0x80) {
    if (data->EventFlag != 0x40) {
      return 0;
    }
    pcVar10 = data->Buf;
    iVar1 = data->CursorPos;
    pcVar4 = pcVar10 + iVar1;
    uVar12 = 0;
    do {
      uVar11 = uVar12;
      s2 = pcVar4;
      n = (int)uVar11;
      if (s2 <= pcVar10) break;
      pcVar4 = s2 + -1;
      uVar12 = (ulong)(n + 1);
    } while ((0x3b < (ulong)(byte)s2[-1]) ||
            ((0x800100100000200U >> ((ulong)(byte)s2[-1] & 0x3f) & 1) == 0));
    local_78 = 0;
    plStack_70 = (long *)0x0;
    if (0 < (this->Commands).Size) {
      __dest = (long *)0x0;
      local_58 = (long *)0x0;
      iVar8 = 0;
      iVar6 = 0;
      lVar9 = 0;
      do {
        iVar5 = Strnicmp((this->Commands).Data[lVar9],s2,n);
        if (iVar5 == 0) {
          ppcVar3 = (this->Commands).Data;
          iVar5 = iVar8;
          if (iVar6 == iVar8) {
            if (iVar8 == 0) {
              iVar6 = 8;
            }
            else {
              iVar6 = iVar8 / 2 + iVar8;
            }
            iVar5 = iVar8 + 1;
            if (iVar8 + 1 < iVar6) {
              iVar5 = iVar6;
            }
            __dest = (long *)ImGui::MemAlloc((long)iVar5 << 3);
            iVar6 = iVar8;
            plStack_70 = __dest;
            if (local_58 != (long *)0x0) {
              memcpy(__dest,local_58,(long)iVar8 << 3);
              ImGui::MemFree(local_58);
              iVar6 = local_78;
            }
          }
          iVar8 = iVar5;
          __dest[iVar6] = (long)ppcVar3[lVar9];
          iVar6 = local_78 + 1;
          local_58 = __dest;
          local_78 = iVar6;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (this->Commands).Size);
      if (iVar6 != 0) {
        if (iVar6 != 1) {
          uVar12 = (ulong)n;
          do {
            if (0 < iVar6) {
              lVar9 = 0;
              iVar8 = 0;
              do {
                if (lVar9 == 0) {
                  iVar8 = toupper((int)*(char *)(*plStack_70 + uVar12));
                }
                else if ((iVar8 == 0) ||
                        (iVar5 = toupper((int)*(char *)(plStack_70[lVar9] + uVar12)), iVar8 != iVar5
                        )) {
                  if (0 < (long)uVar12) {
                    ImGuiInputTextCallbackData::DeleteChars
                              (data,(((int)pcVar10 + iVar1) - *(int *)&data->Buf) - n,n);
                    ImGuiInputTextCallbackData::InsertChars
                              (data,data->CursorPos,(char *)*plStack_70,
                               (char *)*plStack_70 + (uVar12 & 0xffffffff));
                  }
                  AddLog(this,"Possible matches:\n");
                  if (0 < iVar6) {
                    lVar9 = 0;
                    do {
                      AddLog(this,"- %s\n",plStack_70[lVar9]);
                      lVar9 = lVar9 + 1;
                    } while (lVar9 < iVar6);
                    goto LAB_0014f664;
                  }
                  goto LAB_0014f569;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < iVar6);
            }
            uVar12 = uVar12 + 1;
          } while( true );
        }
        ImGuiInputTextCallbackData::DeleteChars
                  (data,(((int)pcVar10 + iVar1) - *(int *)&data->Buf) - n,n);
        ImGuiInputTextCallbackData::InsertChars
                  (data,data->CursorPos,(char *)*plStack_70,(char *)0x0);
        ImGuiInputTextCallbackData::InsertChars(data,data->CursorPos," ",(char *)0x0);
        goto LAB_0014f664;
      }
    }
    AddLog(this,"No match for \"%.*s\"!\n",uVar11,s2);
LAB_0014f569:
    if (plStack_70 == (long *)0x0) {
      return 0;
    }
LAB_0014f664:
    ImGui::MemFree(plStack_70);
    return 0;
  }
  uVar2 = this->HistoryPos;
  if (data->EventKey == 0x204) {
    if (uVar2 == 0xffffffff) {
      return 0;
    }
    uVar7 = 0xffffffff;
    if ((int)(uVar2 + 1) < (this->History).Size) {
      uVar7 = uVar2 + 1;
    }
LAB_0014f678:
    this->HistoryPos = uVar7;
    if (uVar2 == uVar7) {
      return 0;
    }
    if ((int)uVar7 < 0) {
      pcVar10 = "";
      goto LAB_0014f69f;
    }
  }
  else {
    if (data->EventKey != 0x203) {
      return 0;
    }
    if (uVar2 == 0xffffffff) {
      uVar7 = (this->History).Size - 1;
      goto LAB_0014f678;
    }
    if ((int)uVar2 < 1) {
      return 0;
    }
    uVar7 = uVar2 - 1;
    this->HistoryPos = uVar7;
  }
  pcVar10 = (this->History).Data[uVar7];
LAB_0014f69f:
  ImGuiInputTextCallbackData::DeleteChars(data,0,data->BufTextLen);
  ImGuiInputTextCallbackData::InsertChars(data,0,pcVar10,(char *)0x0);
  return 0;
}

Assistant:

int     TextEditCallback(ImGuiInputTextCallbackData* data)
    {
        //AddLog("cursor: %d, selection: %d-%d", data->CursorPos, data->SelectionStart, data->SelectionEnd);
        switch (data->EventFlag)
        {
        case ImGuiInputTextFlags_CallbackCompletion:
            {
                // Example of TEXT COMPLETION

                // Locate beginning of current word
                const char* word_end = data->Buf + data->CursorPos;
                const char* word_start = word_end;
                while (word_start > data->Buf)
                {
                    const char c = word_start[-1];
                    if (c == ' ' || c == '\t' || c == ',' || c == ';')
                        break;
                    word_start--;
                }

                // Build a list of candidates
                ImVector<const char*> candidates;
                for (int i = 0; i < Commands.Size; i++)
                    if (Strnicmp(Commands[i], word_start, (int)(word_end - word_start)) == 0)
                        candidates.push_back(Commands[i]);

                if (candidates.Size == 0)
                {
                    // No match
                    AddLog("No match for \"%.*s\"!\n", (int)(word_end - word_start), word_start);
                }
                else if (candidates.Size == 1)
                {
                    // Single match. Delete the beginning of the word and replace it entirely so we've got nice casing.
                    data->DeleteChars((int)(word_start - data->Buf), (int)(word_end - word_start));
                    data->InsertChars(data->CursorPos, candidates[0]);
                    data->InsertChars(data->CursorPos, " ");
                }
                else
                {
                    // Multiple matches. Complete as much as we can..
                    // So inputing "C"+Tab will complete to "CL" then display "CLEAR" and "CLASSIFY" as matches.
                    int match_len = (int)(word_end - word_start);
                    for (;;)
                    {
                        int c = 0;
                        bool all_candidates_matches = true;
                        for (int i = 0; i < candidates.Size && all_candidates_matches; i++)
                            if (i == 0)
                                c = toupper(candidates[i][match_len]);
                            else if (c == 0 || c != toupper(candidates[i][match_len]))
                                all_candidates_matches = false;
                        if (!all_candidates_matches)
                            break;
                        match_len++;
                    }

                    if (match_len > 0)
                    {
                        data->DeleteChars((int)(word_start - data->Buf), (int)(word_end - word_start));
                        data->InsertChars(data->CursorPos, candidates[0], candidates[0] + match_len);
                    }

                    // List matches
                    AddLog("Possible matches:\n");
                    for (int i = 0; i < candidates.Size; i++)
                        AddLog("- %s\n", candidates[i]);
                }

                break;
            }
        case ImGuiInputTextFlags_CallbackHistory:
            {
                // Example of HISTORY
                const int prev_history_pos = HistoryPos;
                if (data->EventKey == ImGuiKey_UpArrow)
                {
                    if (HistoryPos == -1)
                        HistoryPos = History.Size - 1;
                    else if (HistoryPos > 0)
                        HistoryPos--;
                }
                else if (data->EventKey == ImGuiKey_DownArrow)
                {
                    if (HistoryPos != -1)
                        if (++HistoryPos >= History.Size)
                            HistoryPos = -1;
                }

                // A better implementation would preserve the data on the current input line along with cursor position.
                if (prev_history_pos != HistoryPos)
                {
                    const char* history_str = (HistoryPos >= 0) ? History[HistoryPos] : "";
                    data->DeleteChars(0, data->BufTextLen);
                    data->InsertChars(0, history_str);
                }
            }
        }
        return 0;
    }